

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_base.h
# Opt level: O2

void __thiscall alex::LinearModelBuilder<int>::build(LinearModelBuilder<int> *this)

{
  longdouble lVar1;
  longdouble lVar2;
  int iVar3;
  LinearModel<int> *pLVar4;
  int iVar5;
  undefined1 auVar6 [16];
  longdouble lVar7;
  longdouble lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined8 in_XMM2_Qb;
  
  iVar3 = this->count_;
  if (iVar3 < 2) {
    pLVar4 = this->model_;
    pLVar4->a_ = 0.0;
    pLVar4->b_ = (double)this->y_sum_;
    return;
  }
  lVar7 = (longdouble)iVar3;
  lVar1 = this->x_sum_;
  lVar8 = this->xx_sum_ * lVar7 - lVar1 * lVar1;
  if ((lVar8 != (longdouble)0) || (NAN(lVar8) || NAN((longdouble)0))) {
    lVar2 = this->y_sum_;
    dVar9 = (double)((this->xy_sum_ * lVar7 + -lVar1 * lVar2) / lVar8);
    pLVar4 = this->model_;
    pLVar4->a_ = dVar9;
    pLVar4->b_ = (double)((lVar2 - lVar1 * (longdouble)dVar9) / lVar7);
    if (0.0 < dVar9) {
      return;
    }
    iVar5 = this->x_max_ - this->x_min_;
    if (iVar5 != 0) {
      dVar9 = (this->y_max_ - this->y_min_) / (double)iVar5;
      auVar10._0_8_ = (double)this->x_min_;
      auVar10._8_8_ = in_XMM2_Qb;
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar6 = vxorpd_avx512vl(auVar10,auVar6);
      pLVar4->a_ = dVar9;
      dVar9 = dVar9 * auVar6._0_8_;
      goto LAB_00104403;
    }
    pLVar4->a_ = 0.0;
  }
  else {
    pLVar4 = this->model_;
    pLVar4->a_ = 0.0;
    lVar2 = this->y_sum_;
  }
  dVar9 = (double)lVar2 / (double)iVar3;
LAB_00104403:
  pLVar4->b_ = dVar9;
  return;
}

Assistant:

void build() {
    if (count_ <= 1) {
      model_->a_ = 0;
      model_->b_ = static_cast<double>(y_sum_);
      return;
    }

    if (static_cast<long double>(count_) * xx_sum_ - x_sum_ * x_sum_ == 0) {
      // all values in a bucket have the same key.
      model_->a_ = 0;
      model_->b_ = static_cast<double>(y_sum_) / count_;
      return;
    }

    auto slope = static_cast<double>(
        (static_cast<long double>(count_) * xy_sum_ - x_sum_ * y_sum_) /
        (static_cast<long double>(count_) * xx_sum_ - x_sum_ * x_sum_));
    auto intercept = static_cast<double>(
        (y_sum_ - static_cast<long double>(slope) * x_sum_) / count_);
    model_->a_ = slope;
    model_->b_ = intercept;

    // If floating point precision errors, fit spline
    if (model_->a_ <= 0) {
      if (x_max_ - x_min_ == 0){
        model_->a_ = 0;
        model_->b_ = static_cast<double>(y_sum_) / count_;
      }
      else{
        model_->a_ = (y_max_ - y_min_) / (x_max_ - x_min_);
        model_->b_ = -static_cast<double>(x_min_) * model_->a_;
      }
    }
  }